

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileLangConstruct(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  sxi32 sVar1;
  jx9_value *pObj_00;
  bool bVar2;
  jx9_value *pObj;
  sxu32 nIdx;
  sxi32 nArg;
  SyToken *pNext;
  SyToken *pTmp;
  sxi32 rc;
  sxu32 nKeyID;
  SyString *pName;
  jx9_gen_state *pjStack_18;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  _rc = pGen->pIn;
  pTmp._4_4_ = (int)pGen->pIn->pUserData;
  pGen->pIn = pGen->pIn + 1;
  pName._4_4_ = iCompileFlag;
  pjStack_18 = pGen;
  if (pTmp._4_4_ == 2) {
    _nIdx = (SyToken *)0x0;
    pNext = pGen->pEnd;
    jx9VmEmitInstr(pGen->pVm,4,0,1,(void *)0x0,(sxu32 *)0x0);
    while (sVar1 = jx9GetNextExpr(pjStack_18->pIn,pNext,(SyToken **)&nIdx), sVar1 == 0) {
      if (pjStack_18->pIn < _nIdx) {
        pjStack_18->pEnd = _nIdx;
        pTmp._0_4_ = jx9CompileExpr(pjStack_18,2,
                                    (_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
        if ((sxi32)pTmp == -10) {
          return -10;
        }
        if ((sxi32)pTmp != -3) {
          jx9VmEmitInstr(pjStack_18->pVm,0x3e,1,0,(void *)0x0,(sxu32 *)0x0);
        }
      }
      while( true ) {
        bVar2 = false;
        if (_nIdx < pNext) {
          bVar2 = (_nIdx->nType & 0x20000) != 0;
        }
        if (!bVar2) break;
        _nIdx = _nIdx + 1;
      }
      pjStack_18->pIn = _nIdx;
    }
    pjStack_18->pEnd = pNext;
  }
  else {
    pObj._4_4_ = 0;
    pObj._0_4_ = 0;
    pTmp._0_4_ = jx9CompileExpr(pGen,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if ((sxi32)pTmp == -10) {
      return -10;
    }
    if ((sxi32)pTmp != -3) {
      pObj._4_4_ = 1;
    }
    sVar1 = GenStateFindLiteral(pjStack_18,&_rc->sData,(sxu32 *)&pObj);
    if (sVar1 != 0) {
      pObj_00 = jx9VmReserveConstObj(pjStack_18->pVm,(sxu32 *)&pObj);
      if (pObj_00 == (jx9_value *)0x0) {
        pName._4_4_ = 0;
        sVar1 = GenStateOutOfMem(pjStack_18);
        return sVar1;
      }
      jx9MemObjInitFromString(pjStack_18->pVm,pObj_00,&_rc->sData);
      GenStateInstallLiteral(pjStack_18,pObj_00,(sxu32)pObj);
    }
    jx9VmEmitInstr(pjStack_18->pVm,4,0,(sxu32)pObj,(void *)0x0,(sxu32 *)0x0);
    jx9VmEmitInstr(pjStack_18->pVm,0x10,pObj._4_4_,0,(void *)0x0,(sxu32 *)0x0);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileLangConstruct(jx9_gen_state *pGen,sxi32 iCompileFlag)
{
	SyString *pName;
	sxu32 nKeyID;
	sxi32 rc;
	/* Name of the language construct [i.e: print, die...]*/
	pName = &pGen->pIn->sData;
	nKeyID = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
	pGen->pIn++; /* Jump the language construct keyword */
	if( nKeyID == JX9_TKWRD_PRINT ){
		SyToken *pTmp, *pNext = 0;
		/* Compile arguments one after one */
		pTmp = pGen->pEnd;
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, 1 /* Boolean true index */, 0, 0);
		while( SXRET_OK == jx9GetNextExpr(pGen->pIn, pTmp, &pNext) ){
			if( pGen->pIn < pNext ){
				pGen->pEnd = pNext;
				rc = jx9CompileExpr(&(*pGen), EXPR_FLAG_RDONLY_LOAD/* Do not create variable if inexistant */, 0);
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				if( rc != SXERR_EMPTY ){
					/* Ticket 1433-008: Optimization #1: Consume input directly 
					 * without the overhead of a function call.
					 * This is a very powerful optimization that improve
					 * performance greatly.
					 */
					jx9VmEmitInstr(pGen->pVm,JX9_OP_CONSUME,1,0,0,0);
				}
			}
			/* Jump trailing commas */
			while( pNext < pTmp && (pNext->nType & JX9_TK_COMMA) ){
				pNext++;
			}
			pGen->pIn = pNext;
		}
		/* Restore token stream */
		pGen->pEnd = pTmp;	
	}else{
		sxi32 nArg = 0;
		sxu32 nIdx = 0;
		rc = jx9CompileExpr(&(*pGen), EXPR_FLAG_RDONLY_LOAD/* Do not create variable if inexistant */, 0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}else if(rc != SXERR_EMPTY ){
			nArg = 1;
		}
		if( SXRET_OK != GenStateFindLiteral(&(*pGen), pName, &nIdx) ){
			jx9_value *pObj;
			/* Emit the call instruction */
			pObj = jx9VmReserveConstObj(pGen->pVm, &nIdx);
			if( pObj == 0 ){
				SXUNUSED(iCompileFlag); /* cc warning */
				return GenStateOutOfMem(pGen);
			}
			jx9MemObjInitFromString(pGen->pVm, pObj, pName);
			/* Install in the literal table */
			GenStateInstallLiteral(&(*pGen), pObj, nIdx);
		}
		/* Emit the call instruction */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_LOADC, 0, nIdx, 0, 0);
		jx9VmEmitInstr(pGen->pVm, JX9_OP_CALL, nArg, 0, 0, 0);
	}
	/* Node successfully compiled */
	return SXRET_OK;
}